

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

errr finish_parse_body(parser *p)

{
  ushort uVar1;
  equip_slot *peVar2;
  object *poVar3;
  uint16_t uVar4;
  undefined6 uVar5;
  player_body *ppVar6;
  equip_slot *peVar7;
  angband_constants *paVar8;
  ushort uVar9;
  equip_slot *peVar10;
  player_body *ppVar11;
  equip_slot *peVar12;
  ulong uVar13;
  bool bVar14;
  
  ppVar6 = (player_body *)parser_priv(p);
  paVar8 = z_info;
  bodies = ppVar6;
  z_info->equip_slots_max = 0;
  if (ppVar6 != (player_body *)0x0) {
    uVar9 = 0;
    ppVar11 = ppVar6;
    do {
      uVar1 = ppVar11->count;
      if (uVar9 < uVar1) {
        paVar8->equip_slots_max = uVar1;
        uVar9 = uVar1;
      }
      ppVar11 = ppVar11->next;
    } while (ppVar11 != (player_body *)0x0);
    for (; ppVar6 != (player_body *)0x0; ppVar6 = ppVar6->next) {
      peVar7 = (equip_slot *)mem_zalloc((ulong)z_info->equip_slots_max << 5);
      paVar8 = z_info;
      peVar10 = ppVar6->slots;
      if (peVar10 != (equip_slot *)0x0) {
        if (z_info->equip_slots_max != 0) {
          peVar12 = peVar7;
          uVar13 = 1;
          do {
            peVar2 = peVar10->next;
            uVar4 = peVar10->type;
            uVar5 = *(undefined6 *)&peVar10->field_0xa;
            poVar3 = peVar10->obj;
            peVar12->name = peVar10->name;
            peVar12->obj = poVar3;
            peVar12->next = peVar2;
            peVar12->type = uVar4;
            *(undefined6 *)&peVar12->field_0xa = uVar5;
            peVar10 = peVar10->next;
            if (peVar10 == (equip_slot *)0x0) break;
            peVar12 = peVar12 + 1;
            bVar14 = uVar13 < paVar8->equip_slots_max;
            uVar13 = uVar13 + 1;
          } while (bVar14);
          if (paVar8->equip_slots_max != 0) {
            uVar13 = 0;
            peVar10 = peVar7;
            do {
              if (peVar10->next != (equip_slot *)0x0) {
                peVar10->next = peVar10 + 1;
                paVar8 = z_info;
              }
              uVar13 = uVar13 + 1;
              peVar10 = peVar10 + 1;
            } while (uVar13 < paVar8->equip_slots_max);
          }
        }
        peVar10 = ppVar6->slots;
        while (peVar10 != (equip_slot *)0x0) {
          peVar12 = peVar10->next;
          mem_free(peVar10);
          peVar10 = peVar12;
        }
      }
      ppVar6->slots = peVar7;
    }
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_body(struct parser *p) {
	struct player_body *b;
	int i;
	bodies = parser_priv(p);

	/* Scan the list for the max slots */
	z_info->equip_slots_max = 0;
	for (b = bodies; b; b = b->next) {
		if (b->count > z_info->equip_slots_max)
			z_info->equip_slots_max = b->count;
	}

	/* Allocate the slot list and copy */
	for (b = bodies; b; b = b->next) {
		struct equip_slot *s_new;

		s_new = mem_zalloc(z_info->equip_slots_max * sizeof(*s_new));
		if (b->slots) {
			struct equip_slot *s_temp, *s_old = b->slots;

			/* Allocate space and copy */
			for (i = 0; i < z_info->equip_slots_max; i++) {
				memcpy(&s_new[i], s_old, sizeof(*s_old));
				s_old = s_old->next;
				if (!s_old) break;
			}

			/* Make next point correctly */
			for (i = 0; i < z_info->equip_slots_max; i++)
				if (s_new[i].next)
					s_new[i].next = &s_new[i + 1];

			/* Tidy up */
			s_old = b->slots;
			s_temp = s_old;
			while (s_temp) {
				s_temp = s_old->next;
				mem_free(s_old);
				s_old = s_temp;
			}
		}
		b->slots = s_new;
	}
	parser_destroy(p);
	return 0;
}